

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMInteractionType.hpp
# Opt level: O1

void __thiscall OpenMD::EAMInteractionType::~EAMInteractionType(EAMInteractionType *this)

{
  pointer pdVar1;
  
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__EAMInteractionType_002ff8d0;
  pdVar1 = (this->phi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->phi_).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__NonBondedInteractionType_002ff798;
  (this->super_NonBondedInteractionType).properties_._vptr_PropertyMap =
       (_func_int **)&PTR__PropertyMap_002fc3b0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
  ::~_Rb_tree(&(this->super_NonBondedInteractionType).properties_.propMap_._M_t);
  operator_delete(this,0xe0);
  return;
}

Assistant:

EAMInteractionType(RealType re, RealType alpha, RealType beta, RealType A,
                       RealType B, RealType kappa, RealType lambda) {
      interactionType_ = eamitZhou;
      setEAMZhou();
      re_     = re;
      alpha_  = alpha;
      beta_   = beta;
      A_      = A;
      B_      = B;
      kappa_  = kappa;
      lambda_ = lambda;
    }